

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::BVHNIntersector1<4,_16781328,_false,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 (*pauVar16) [16];
  undefined8 uVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined4 uVar26;
  ulong unaff_R15;
  undefined4 uVar27;
  int iVar28;
  float fVar29;
  float fVar30;
  float fVar49;
  float fVar51;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar50;
  float fVar52;
  float fVar53;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  float fVar66;
  float fVar68;
  vfloat4 a0;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar77;
  float fVar78;
  vint4 ai_3;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar92;
  float fVar93;
  vint4 bi_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar98;
  float fVar99;
  vint4 ai;
  undefined1 auVar97 [16];
  float fVar100;
  float fVar102;
  float fVar103;
  vint4 ai_1;
  undefined1 auVar101 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar108;
  undefined1 auVar107 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  RayHit *local_10c0;
  Intersectors *local_10b8;
  RayQueryContext *local_10b0;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10b0 = context;
  local_10b8 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1048 = aVar6.x;
    local_1058 = aVar6.y;
    local_1038 = aVar6.z;
    auVar31 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar60 = rsqrtss(auVar31,auVar31);
    fVar29 = auVar60._0_4_;
    local_fb8[0] = fVar29 * 1.5 - fVar29 * fVar29 * auVar31._0_4_ * 0.5 * fVar29;
    auVar84._0_4_ = local_1048 * local_fb8[0];
    auVar84._4_4_ = local_1058 * local_fb8[0];
    auVar84._8_4_ = local_1038 * local_fb8[0];
    auVar84._12_4_ = aVar6.field_3.w * local_fb8[0];
    uVar21 = CONCAT44(auVar84._4_4_,auVar84._4_4_);
    auVar32._0_8_ = uVar21 ^ 0x8000000080000000;
    auVar32._8_4_ = -auVar84._12_4_;
    auVar32._12_4_ = -auVar84._12_4_;
    auVar91._0_12_ = ZEXT812(0);
    auVar91._12_4_ = 0;
    auVar32 = blendps(auVar32,auVar91,0xe);
    auVar31._4_4_ = auVar32._0_4_;
    auVar31._0_4_ = auVar84._8_4_;
    auVar31._8_4_ = auVar32._4_4_;
    auVar31._12_4_ = 0;
    auVar60._4_4_ = auVar32._0_4_;
    auVar60._0_4_ = auVar84._8_4_;
    auVar60._8_4_ = auVar32._4_4_;
    auVar60._12_4_ = 0;
    auVar101 = dpps(auVar60 << 0x20,auVar31 << 0x20,0x7f);
    uVar21 = CONCAT44(auVar84._12_4_,auVar84._8_4_);
    auVar86._0_8_ = uVar21 ^ 0x8000000080000000;
    auVar86._8_4_ = -auVar84._8_4_;
    auVar86._12_4_ = -auVar84._12_4_;
    auVar32 = insertps(auVar86,auVar84,0x2a);
    auVar60 = dpps(auVar32,auVar32,0x7f);
    iVar28 = -(uint)(auVar60._0_4_ < auVar101._0_4_);
    auVar101._4_4_ = iVar28;
    auVar101._0_4_ = iVar28;
    auVar101._8_4_ = iVar28;
    auVar101._12_4_ = iVar28;
    auVar31 = blendvps(auVar32,auVar31 << 0x20,auVar101);
    auVar60 = dpps(auVar31,auVar31,0x7f);
    auVar32 = rsqrtss(auVar60,auVar60);
    fVar29 = auVar32._0_4_;
    fVar29 = fVar29 * 1.5 - fVar29 * fVar29 * auVar60._0_4_ * 0.5 * fVar29;
    fVar30 = fVar29 * auVar31._0_4_;
    fVar49 = fVar29 * auVar31._4_4_;
    fVar51 = fVar29 * auVar31._8_4_;
    fVar29 = fVar29 * auVar31._12_4_;
    fVar85 = fVar49 * auVar84._0_4_ - auVar84._4_4_ * fVar30;
    fVar92 = fVar51 * auVar84._4_4_ - auVar84._8_4_ * fVar49;
    fVar93 = fVar30 * auVar84._8_4_ - auVar84._0_4_ * fVar51;
    auVar87._12_4_ = fVar29 * auVar84._12_4_ - auVar84._12_4_ * fVar29;
    auVar87._0_8_ = CONCAT44(fVar93,fVar92);
    auVar87._8_4_ = fVar85;
    auVar97._8_4_ = fVar85;
    auVar97._0_8_ = auVar87._0_8_;
    auVar97._12_4_ = auVar87._12_4_;
    auVar31 = dpps(auVar97,auVar87,0x7f);
    auVar60 = rsqrtss(auVar31,auVar31);
    fVar29 = auVar60._0_4_;
    fVar29 = fVar29 * 1.5 - fVar29 * fVar29 * auVar31._0_4_ * 0.5 * fVar29;
    local_f88._4_4_ = fVar29 * fVar85;
    local_f88._0_4_ = fVar51;
    local_f88._8_4_ = auVar84._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar29 * fVar93;
    local_f98._0_4_ = fVar49;
    local_f98._8_4_ = auVar84._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar29 * fVar92;
    local_fa8._0_4_ = fVar30;
    local_fa8._8_4_ = auVar84._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar22 = (undefined1 (*) [16])local_f68;
      local_1088 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_10d8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_10e8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar29 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar30 = 0.0;
      if (0.0 <= fVar29) {
        fVar30 = fVar29;
      }
      fVar29 = (ray->super_RayK<1>).tfar;
      fVar49 = 0.0;
      if (0.0 <= fVar29) {
        fVar49 = fVar29;
      }
      auVar33._4_4_ = -(uint)(ABS(local_1058) < DAT_01ff1d40._4_4_);
      auVar33._0_4_ = -(uint)(ABS(local_1048) < (float)DAT_01ff1d40);
      auVar33._8_4_ = -(uint)(ABS(local_1038) < DAT_01ff1d40._8_4_);
      auVar33._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01ff1d40._12_4_);
      auVar60 = blendvps((undefined1  [16])aVar6,_DAT_01ff1d40,auVar33);
      auVar31 = rcpps(auVar33,auVar60);
      local_1098 = auVar31._0_4_;
      local_10a8 = auVar31._4_4_;
      local_1078 = auVar31._8_4_;
      local_1098 = (1.0 - auVar60._0_4_ * local_1098) * local_1098 + local_1098;
      local_10a8 = (1.0 - auVar60._4_4_ * local_10a8) * local_10a8 + local_10a8;
      local_1078 = (1.0 - auVar60._8_4_ * local_1078) * local_1078 + local_1078;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      uVar21 = (ulong)(local_1098 < 0.0) * 0x10;
      uVar24 = (ulong)(local_10a8 < 0.0) << 4 | 0x20;
      uVar25 = (ulong)(local_1078 < 0.0) << 4 | 0x40;
      local_1068._4_4_ = fVar30;
      local_1068._0_4_ = fVar30;
      local_1068._8_4_ = fVar30;
      local_1068._12_4_ = fVar30;
      fStack_10e4 = local_10e8;
      fStack_10e0 = local_10e8;
      fStack_10dc = local_10e8;
      fStack_1074 = local_1078;
      fStack_1070 = local_1078;
      fStack_106c = local_1078;
      fStack_1084 = local_1088;
      fStack_1080 = local_1088;
      fStack_107c = local_1088;
      fStack_10d4 = local_10d8;
      fStack_10d0 = local_10d8;
      fStack_10cc = local_10d8;
      fStack_1094 = local_1098;
      fStack_1090 = local_1098;
      fStack_108c = local_1098;
      fStack_10a4 = local_10a8;
      fStack_10a0 = local_10a8;
      fStack_109c = local_10a8;
      local_10c0 = ray;
      fVar29 = fVar49;
      fVar30 = fVar49;
      fVar51 = fVar49;
      auVar31 = local_1068;
      fVar85 = local_1098;
      fVar92 = local_1098;
      fVar93 = local_1098;
      fVar108 = local_1098;
      fVar77 = local_1088;
      fVar50 = local_1088;
      fVar105 = local_1088;
      fVar78 = local_1088;
      fVar52 = local_10e8;
      fVar106 = local_10e8;
      fVar79 = local_10e8;
      fVar53 = local_10e8;
      fVar58 = local_10d8;
      fVar59 = local_10d8;
      fVar66 = local_10d8;
      fVar67 = local_10d8;
      fVar68 = local_1078;
      fVar69 = local_1078;
      fVar70 = local_1078;
      fVar71 = local_1078;
      fVar94 = local_10a8;
      fVar95 = local_10a8;
      fVar96 = local_10a8;
      fVar98 = local_10a8;
      do {
        do {
          if (pauVar22 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar16 = pauVar22 + -1;
          pauVar22 = pauVar22 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar16 + 8));
        uVar19 = *(ulong *)*pauVar22;
        do {
          if ((uVar19 & 8) == 0) {
            fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar20 = (uint)uVar19 & 7;
            uVar18 = uVar19 & 0xfffffffffffffff0;
            uVar27 = (undefined4)(unaff_R15 >> 0x20);
            if (uVar20 == 3) {
              local_fe8 = *(float *)(uVar18 + 0x20);
              fStack_fe4 = *(float *)(uVar18 + 0x24);
              fStack_fe0 = *(float *)(uVar18 + 0x28);
              fStack_fdc = *(float *)(uVar18 + 0x2c);
              local_ff8 = *(float *)(uVar18 + 0x30);
              fStack_ff4 = *(float *)(uVar18 + 0x34);
              fStack_ff0 = *(float *)(uVar18 + 0x38);
              fStack_fec = *(float *)(uVar18 + 0x3c);
              local_1018 = *(float *)(uVar18 + 0x50);
              fStack_1014 = *(float *)(uVar18 + 0x54);
              fStack_1010 = *(float *)(uVar18 + 0x58);
              fStack_100c = *(float *)(uVar18 + 0x5c);
              local_1008 = *(float *)(uVar18 + 0x60);
              fStack_1004 = *(float *)(uVar18 + 100);
              fStack_1000 = *(float *)(uVar18 + 0x68);
              fStack_ffc = *(float *)(uVar18 + 0x6c);
              local_1028 = *(undefined8 *)(uVar18 + 0x70);
              uStack_1020 = *(undefined8 *)(uVar18 + 0x78);
              uVar10 = local_1028;
              uVar17 = uStack_1020;
              fVar94 = 1.0 - fVar5;
              fVar95 = fVar94 * 0.0;
              local_fd8 = *(float *)(uVar18 + 0xe0) * fVar5 + fVar95;
              fStack_fd4 = *(float *)(uVar18 + 0xe4) * fVar5 + fVar95;
              fStack_fd0 = *(float *)(uVar18 + 0xe8) * fVar5 + fVar95;
              fStack_fcc = *(float *)(uVar18 + 0xec) * fVar5 + fVar95;
              local_fc8 = *(float *)(uVar18 + 0xf0) * fVar5 + fVar95;
              fStack_fc4 = *(float *)(uVar18 + 0xf4) * fVar5 + fVar95;
              fStack_fc0 = *(float *)(uVar18 + 0xf8) * fVar5 + fVar95;
              fStack_fbc = *(float *)(uVar18 + 0xfc) * fVar5 + fVar95;
              auVar74._0_4_ =
                   local_1048 * local_fe8 +
                   local_1058 * local_1018 + local_1038 * *(float *)(uVar18 + 0x80);
              auVar74._4_4_ =
                   fStack_1044 * fStack_fe4 +
                   fStack_1054 * fStack_1014 + fStack_1034 * *(float *)(uVar18 + 0x84);
              auVar74._8_4_ =
                   fStack_1040 * fStack_fe0 +
                   fStack_1050 * fStack_1010 + fStack_1030 * *(float *)(uVar18 + 0x88);
              auVar74._12_4_ =
                   fStack_103c * fStack_fdc +
                   fStack_104c * fStack_100c + fStack_102c * *(float *)(uVar18 + 0x8c);
              auVar81._0_4_ =
                   local_1048 * local_ff8 +
                   local_1058 * local_1008 + local_1038 * *(float *)(uVar18 + 0x90);
              auVar81._4_4_ =
                   fStack_1044 * fStack_ff4 +
                   fStack_1054 * fStack_1004 + fStack_1034 * *(float *)(uVar18 + 0x94);
              auVar81._8_4_ =
                   fStack_1040 * fStack_ff0 +
                   fStack_1050 * fStack_1000 + fStack_1030 * *(float *)(uVar18 + 0x98);
              auVar81._12_4_ =
                   fStack_103c * fStack_fec +
                   fStack_104c * fStack_ffc + fStack_102c * *(float *)(uVar18 + 0x9c);
              fVar85 = (float)DAT_01ff1d40;
              fVar92 = DAT_01ff1d40._4_4_;
              fVar93 = DAT_01ff1d40._8_4_;
              fVar108 = DAT_01ff1d40._12_4_;
              auVar36._4_4_ = -(uint)(ABS(auVar74._4_4_) < fVar92);
              auVar36._0_4_ = -(uint)(ABS(auVar74._0_4_) < fVar85);
              auVar36._8_4_ = -(uint)(ABS(auVar74._8_4_) < fVar93);
              auVar36._12_4_ = -(uint)(ABS(auVar74._12_4_) < fVar108);
              auVar32 = blendvps(auVar74,_DAT_01ff1d40,auVar36);
              auVar37._4_4_ = -(uint)(ABS(auVar81._4_4_) < fVar92);
              auVar37._0_4_ = -(uint)(ABS(auVar81._0_4_) < fVar85);
              auVar37._8_4_ = -(uint)(ABS(auVar81._8_4_) < fVar93);
              auVar37._12_4_ = -(uint)(ABS(auVar81._12_4_) < fVar108);
              auVar101 = blendvps(auVar81,_DAT_01ff1d40,auVar37);
              local_1108 = (float)*(undefined8 *)(uVar18 + 0xa0);
              fStack_1104 = (float)((ulong)*(undefined8 *)(uVar18 + 0xa0) >> 0x20);
              fStack_1100 = (float)*(undefined8 *)(uVar18 + 0xa8);
              fStack_10fc = (float)((ulong)*(undefined8 *)(uVar18 + 0xa8) >> 0x20);
              local_1028._4_4_ = (float)((ulong)local_1028 >> 0x20);
              uStack_1020._4_4_ = (float)((ulong)uStack_1020 >> 0x20);
              auVar62._0_4_ =
                   local_1048 * *(float *)(uVar18 + 0x40) +
                   local_1058 * (float)local_1028 + local_1038 * local_1108;
              auVar62._4_4_ =
                   fStack_1044 * *(float *)(uVar18 + 0x44) +
                   fStack_1054 * local_1028._4_4_ + fStack_1034 * fStack_1104;
              auVar62._8_4_ =
                   fStack_1040 * *(float *)(uVar18 + 0x48) +
                   fStack_1050 * (float)uStack_1020 + fStack_1030 * fStack_1100;
              auVar62._12_4_ =
                   fStack_103c * *(float *)(uVar18 + 0x4c) +
                   fStack_104c * uStack_1020._4_4_ + fStack_102c * fStack_10fc;
              auVar38._4_4_ = -(uint)(ABS(auVar62._4_4_) < fVar92);
              auVar38._0_4_ = -(uint)(ABS(auVar62._0_4_) < fVar85);
              auVar38._8_4_ = -(uint)(ABS(auVar62._8_4_) < fVar93);
              auVar38._12_4_ = -(uint)(ABS(auVar62._12_4_) < fVar108);
              auVar60 = blendvps(auVar62,_DAT_01ff1d40,auVar38);
              auVar31 = rcpps(auVar38,auVar32);
              fVar85 = auVar31._0_4_;
              fVar108 = auVar31._4_4_;
              fVar105 = auVar31._8_4_;
              fVar106 = auVar31._12_4_;
              fVar85 = (1.0 - auVar32._0_4_ * fVar85) * fVar85 + fVar85;
              fVar108 = (1.0 - auVar32._4_4_ * fVar108) * fVar108 + fVar108;
              fVar105 = (1.0 - auVar32._8_4_ * fVar105) * fVar105 + fVar105;
              fVar106 = (1.0 - auVar32._12_4_ * fVar106) * fVar106 + fVar106;
              auVar31 = rcpps(auVar31,auVar101);
              fVar92 = auVar31._0_4_;
              auVar82._0_4_ = auVar101._0_4_ * fVar92;
              fVar77 = auVar31._4_4_;
              auVar82._4_4_ = auVar101._4_4_ * fVar77;
              fVar78 = auVar31._8_4_;
              auVar82._8_4_ = auVar101._8_4_ * fVar78;
              fVar79 = auVar31._12_4_;
              auVar82._12_4_ = auVar101._12_4_ * fVar79;
              fVar92 = (1.0 - auVar82._0_4_) * fVar92 + fVar92;
              fVar77 = (1.0 - auVar82._4_4_) * fVar77 + fVar77;
              fVar78 = (1.0 - auVar82._8_4_) * fVar78 + fVar78;
              fVar79 = (1.0 - auVar82._12_4_) * fVar79 + fVar79;
              auVar31 = rcpps(auVar82,auVar60);
              fVar93 = auVar31._0_4_;
              fVar50 = auVar31._4_4_;
              fVar52 = auVar31._8_4_;
              fVar53 = auVar31._12_4_;
              fVar93 = (1.0 - auVar60._0_4_ * fVar93) * fVar93 + fVar93;
              fVar50 = (1.0 - auVar60._4_4_ * fVar50) * fVar50 + fVar50;
              fVar52 = (1.0 - auVar60._8_4_ * fVar52) * fVar52 + fVar52;
              fVar53 = (1.0 - auVar60._12_4_ * fVar53) * fVar53 + fVar53;
              fVar58 = local_fe8 * local_1088 +
                       local_1018 * local_10d8 +
                       *(float *)(uVar18 + 0x80) * local_10e8 + *(float *)(uVar18 + 0xb0);
              fVar66 = fStack_fe4 * fStack_1084 +
                       fStack_1014 * fStack_10d4 +
                       *(float *)(uVar18 + 0x84) * fStack_10e4 + *(float *)(uVar18 + 0xb4);
              fVar68 = fStack_fe0 * fStack_1080 +
                       fStack_1010 * fStack_10d0 +
                       *(float *)(uVar18 + 0x88) * fStack_10e0 + *(float *)(uVar18 + 0xb8);
              fVar70 = fStack_fdc * fStack_107c +
                       fStack_100c * fStack_10cc +
                       *(float *)(uVar18 + 0x8c) * fStack_10dc + *(float *)(uVar18 + 0xbc);
              fVar59 = local_ff8 * local_1088 +
                       local_1008 * local_10d8 +
                       *(float *)(uVar18 + 0x90) * local_10e8 + *(float *)(uVar18 + 0xc0);
              fVar67 = fStack_ff4 * fStack_1084 +
                       fStack_1004 * fStack_10d4 +
                       *(float *)(uVar18 + 0x94) * fStack_10e4 + *(float *)(uVar18 + 0xc4);
              fVar69 = fStack_ff0 * fStack_1080 +
                       fStack_1000 * fStack_10d0 +
                       *(float *)(uVar18 + 0x98) * fStack_10e0 + *(float *)(uVar18 + 200);
              fVar71 = fStack_fec * fStack_107c +
                       fStack_ffc * fStack_10cc +
                       *(float *)(uVar18 + 0x9c) * fStack_10dc + *(float *)(uVar18 + 0xcc);
              fVar109 = *(float *)(uVar18 + 0x40) * local_1088 +
                        (float)local_1028 * local_10d8 +
                        local_1108 * local_10e8 + *(float *)(uVar18 + 0xd0);
              fVar110 = *(float *)(uVar18 + 0x44) * fStack_1084 +
                        local_1028._4_4_ * fStack_10d4 +
                        fStack_1104 * fStack_10e4 + *(float *)(uVar18 + 0xd4);
              fVar111 = *(float *)(uVar18 + 0x48) * fStack_1080 +
                        (float)uStack_1020 * fStack_10d0 +
                        fStack_1100 * fStack_10e0 + *(float *)(uVar18 + 0xd8);
              fVar112 = *(float *)(uVar18 + 0x4c) * fStack_107c +
                        uStack_1020._4_4_ * fStack_10cc +
                        fStack_10fc * fStack_10dc + *(float *)(uVar18 + 0xdc);
              fVar100 = (local_fd8 - fVar58) * fVar85;
              fVar102 = (fStack_fd4 - fVar66) * fVar108;
              fVar103 = (fStack_fd0 - fVar68) * fVar105;
              fVar104 = (fStack_fcc - fVar70) * fVar106;
              fVar85 = ((*(float *)(uVar18 + 0x110) * fVar5 + fVar94) - fVar58) * fVar85;
              fVar108 = ((*(float *)(uVar18 + 0x114) * fVar5 + fVar94) - fVar66) * fVar108;
              fVar105 = ((*(float *)(uVar18 + 0x118) * fVar5 + fVar94) - fVar68) * fVar105;
              fVar106 = ((*(float *)(uVar18 + 0x11c) * fVar5 + fVar94) - fVar70) * fVar106;
              fVar58 = (local_fc8 - fVar59) * fVar92;
              fVar66 = (fStack_fc4 - fVar67) * fVar77;
              fVar68 = (fStack_fc0 - fVar69) * fVar78;
              fVar70 = (fStack_fbc - fVar71) * fVar79;
              fVar96 = ((fVar95 + *(float *)(uVar18 + 0x100) * fVar5) - fVar109) * fVar93;
              fVar98 = ((fVar95 + *(float *)(uVar18 + 0x104) * fVar5) - fVar110) * fVar50;
              fVar99 = ((fVar95 + *(float *)(uVar18 + 0x108) * fVar5) - fVar111) * fVar52;
              fVar95 = ((fVar95 + *(float *)(uVar18 + 0x10c) * fVar5) - fVar112) * fVar53;
              fVar92 = ((*(float *)(uVar18 + 0x120) * fVar5 + fVar94) - fVar59) * fVar92;
              fVar77 = ((*(float *)(uVar18 + 0x124) * fVar5 + fVar94) - fVar67) * fVar77;
              fVar78 = ((*(float *)(uVar18 + 0x128) * fVar5 + fVar94) - fVar69) * fVar78;
              fVar79 = ((*(float *)(uVar18 + 300) * fVar5 + fVar94) - fVar71) * fVar79;
              fVar93 = ((fVar5 * *(float *)(uVar18 + 0x130) + fVar94) - fVar109) * fVar93;
              fVar50 = ((fVar5 * *(float *)(uVar18 + 0x134) + fVar94) - fVar110) * fVar50;
              fVar52 = ((fVar5 * *(float *)(uVar18 + 0x138) + fVar94) - fVar111) * fVar52;
              fVar53 = ((fVar5 * *(float *)(uVar18 + 0x13c) + fVar94) - fVar112) * fVar53;
              auVar39._0_4_ =
                   (uint)((int)fVar92 < (int)fVar58) * (int)fVar92 |
                   (uint)((int)fVar92 >= (int)fVar58) * (int)fVar58;
              auVar39._4_4_ =
                   (uint)((int)fVar77 < (int)fVar66) * (int)fVar77 |
                   (uint)((int)fVar77 >= (int)fVar66) * (int)fVar66;
              auVar39._8_4_ =
                   (uint)((int)fVar78 < (int)fVar68) * (int)fVar78 |
                   (uint)((int)fVar78 >= (int)fVar68) * (int)fVar68;
              auVar39._12_4_ =
                   (uint)((int)fVar79 < (int)fVar70) * (int)fVar79 |
                   (uint)((int)fVar79 >= (int)fVar70) * (int)fVar70;
              auVar63._0_4_ =
                   (uint)((int)fVar93 < (int)fVar96) * (int)fVar93 |
                   (uint)((int)fVar93 >= (int)fVar96) * (int)fVar96;
              auVar63._4_4_ =
                   (uint)((int)fVar50 < (int)fVar98) * (int)fVar50 |
                   (uint)((int)fVar50 >= (int)fVar98) * (int)fVar98;
              auVar63._8_4_ =
                   (uint)((int)fVar52 < (int)fVar99) * (int)fVar52 |
                   (uint)((int)fVar52 >= (int)fVar99) * (int)fVar99;
              auVar63._12_4_ =
                   (uint)((int)fVar53 < (int)fVar95) * (int)fVar53 |
                   (uint)((int)fVar53 >= (int)fVar95) * (int)fVar95;
              auVar31 = maxps(auVar39,auVar63);
              auVar64._0_4_ =
                   (uint)((int)fVar85 < (int)fVar100) * (int)fVar85 |
                   (uint)((int)fVar85 >= (int)fVar100) * (int)fVar100;
              auVar64._4_4_ =
                   (uint)((int)fVar108 < (int)fVar102) * (int)fVar108 |
                   (uint)((int)fVar108 >= (int)fVar102) * (int)fVar102;
              auVar64._8_4_ =
                   (uint)((int)fVar105 < (int)fVar103) * (int)fVar105 |
                   (uint)((int)fVar105 >= (int)fVar103) * (int)fVar103;
              auVar64._12_4_ =
                   (uint)((int)fVar106 < (int)fVar104) * (int)fVar106 |
                   (uint)((int)fVar106 >= (int)fVar104) * (int)fVar104;
              auVar89._0_4_ =
                   (uint)((int)fVar85 < (int)fVar100) * (int)fVar100 |
                   (uint)((int)fVar85 >= (int)fVar100) * (int)fVar85;
              auVar89._4_4_ =
                   (uint)((int)fVar108 < (int)fVar102) * (int)fVar102 |
                   (uint)((int)fVar108 >= (int)fVar102) * (int)fVar108;
              auVar89._8_4_ =
                   (uint)((int)fVar105 < (int)fVar103) * (int)fVar103 |
                   (uint)((int)fVar105 >= (int)fVar103) * (int)fVar105;
              auVar89._12_4_ =
                   (uint)((int)fVar106 < (int)fVar104) * (int)fVar104 |
                   (uint)((int)fVar106 >= (int)fVar104) * (int)fVar106;
              auVar107._0_4_ =
                   (uint)((int)fVar92 < (int)fVar58) * (int)fVar58 |
                   (uint)((int)fVar92 >= (int)fVar58) * (int)fVar92;
              auVar107._4_4_ =
                   (uint)((int)fVar77 < (int)fVar66) * (int)fVar66 |
                   (uint)((int)fVar77 >= (int)fVar66) * (int)fVar77;
              auVar107._8_4_ =
                   (uint)((int)fVar78 < (int)fVar68) * (int)fVar68 |
                   (uint)((int)fVar78 >= (int)fVar68) * (int)fVar78;
              auVar107._12_4_ =
                   (uint)((int)fVar79 < (int)fVar70) * (int)fVar70 |
                   (uint)((int)fVar79 >= (int)fVar70) * (int)fVar79;
              auVar55._0_4_ =
                   (uint)((int)fVar93 < (int)fVar96) * (int)fVar96 |
                   (uint)((int)fVar93 >= (int)fVar96) * (int)fVar93;
              auVar55._4_4_ =
                   (uint)((int)fVar50 < (int)fVar98) * (int)fVar98 |
                   (uint)((int)fVar50 >= (int)fVar98) * (int)fVar50;
              auVar55._8_4_ =
                   (uint)((int)fVar52 < (int)fVar99) * (int)fVar99 |
                   (uint)((int)fVar52 >= (int)fVar99) * (int)fVar52;
              auVar55._12_4_ =
                   (uint)((int)fVar53 < (int)fVar95) * (int)fVar95 |
                   (uint)((int)fVar53 >= (int)fVar95) * (int)fVar53;
              auVar32 = minps(auVar107,auVar55);
              auVar60 = maxps(local_1068,auVar64);
              local_10f8 = maxps(auVar60,auVar31);
              auVar40._4_4_ = fVar29;
              auVar40._0_4_ = fVar49;
              auVar40._8_4_ = fVar30;
              auVar40._12_4_ = fVar51;
              auVar31 = minps(auVar40,auVar89);
              auVar31 = minps(auVar31,auVar32);
              auVar56._4_4_ = -(uint)(local_10f8._4_4_ <= auVar31._4_4_);
              auVar56._0_4_ = -(uint)(local_10f8._0_4_ <= auVar31._0_4_);
              auVar56._8_4_ = -(uint)(local_10f8._8_4_ <= auVar31._8_4_);
              auVar56._12_4_ = -(uint)(local_10f8._12_4_ <= auVar31._12_4_);
              uVar26 = movmskps((int)unaff_R15,auVar56);
              unaff_R15 = CONCAT44(uVar27,uVar26);
              auVar31 = local_1068;
              fVar85 = local_1098;
              fVar92 = fStack_1094;
              fVar93 = fStack_1090;
              fVar108 = fStack_108c;
              fVar77 = local_1088;
              fVar50 = fStack_1084;
              fVar105 = fStack_1080;
              fVar78 = fStack_107c;
              fVar52 = local_10e8;
              fVar106 = fStack_10e4;
              fVar79 = fStack_10e0;
              fVar53 = fStack_10dc;
              fVar58 = local_10d8;
              fVar59 = fStack_10d4;
              fVar66 = fStack_10d0;
              fVar67 = fStack_10cc;
              fVar68 = local_1078;
              fVar69 = fStack_1074;
              fVar70 = fStack_1070;
              fVar71 = fStack_106c;
              fVar94 = local_10a8;
              fVar95 = fStack_10a4;
              fVar96 = fStack_10a0;
              fVar98 = fStack_109c;
              local_1028 = uVar10;
              uStack_1020 = uVar17;
            }
            else {
              pfVar3 = (float *)(uVar18 + 0x80 + uVar21);
              pfVar1 = (float *)(uVar18 + 0x20 + uVar21);
              pfVar4 = (float *)(uVar18 + 0x80 + uVar24);
              pfVar2 = (float *)(uVar18 + 0x20 + uVar24);
              auVar34._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar77) * fVar85;
              auVar34._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar50) * fVar92;
              auVar34._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar105) * fVar93;
              auVar34._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar78) * fVar108;
              auVar61._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar58) * fVar94;
              auVar61._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar59) * fVar95;
              auVar61._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar66) * fVar96;
              auVar61._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar67) * fVar98;
              pfVar2 = (float *)(uVar18 + 0x80 + uVar25);
              pfVar1 = (float *)(uVar18 + 0x20 + uVar25);
              auVar72._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar52) * fVar68;
              auVar72._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar106) * fVar69;
              auVar72._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar79) * fVar70;
              auVar72._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar53) * fVar71;
              auVar60 = maxps(auVar61,auVar72);
              pfVar2 = (float *)(uVar18 + 0x80 + (uVar21 ^ 0x10));
              pfVar1 = (float *)(uVar18 + 0x20 + (uVar21 ^ 0x10));
              auVar80._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar77) * fVar85;
              auVar80._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar50) * fVar92;
              auVar80._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar105) * fVar93;
              auVar80._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar78) * fVar108;
              pfVar2 = (float *)(uVar18 + 0x80 + (uVar24 ^ 0x10));
              pfVar1 = (float *)(uVar18 + 0x20 + (uVar24 ^ 0x10));
              auVar88._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar58) * fVar94;
              auVar88._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar59) * fVar95;
              auVar88._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar66) * fVar96;
              auVar88._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar67) * fVar98;
              pfVar2 = (float *)(uVar18 + 0x80 + (uVar25 ^ 0x10));
              pfVar1 = (float *)(uVar18 + 0x20 + (uVar25 ^ 0x10));
              auVar73._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar52) * fVar68;
              auVar73._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar106) * fVar69;
              auVar73._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar79) * fVar70;
              auVar73._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar53) * fVar71;
              auVar101 = minps(auVar88,auVar73);
              auVar32 = maxps(auVar31,auVar34);
              local_10f8 = maxps(auVar32,auVar60);
              auVar35._4_4_ = fVar29;
              auVar35._0_4_ = fVar49;
              auVar35._8_4_ = fVar30;
              auVar35._12_4_ = fVar51;
              auVar60 = minps(auVar35,auVar80);
              auVar60 = minps(auVar60,auVar101);
              if (uVar20 == 6) {
                bVar12 = (fVar5 < *(float *)(uVar18 + 0xf0) && *(float *)(uVar18 + 0xe0) <= fVar5)
                         && local_10f8._0_4_ <= auVar60._0_4_;
                bVar13 = (fVar5 < *(float *)(uVar18 + 0xf4) && *(float *)(uVar18 + 0xe4) <= fVar5)
                         && local_10f8._4_4_ <= auVar60._4_4_;
                bVar14 = (fVar5 < *(float *)(uVar18 + 0xf8) && *(float *)(uVar18 + 0xe8) <= fVar5)
                         && local_10f8._8_4_ <= auVar60._8_4_;
                bVar15 = (fVar5 < *(float *)(uVar18 + 0xfc) && *(float *)(uVar18 + 0xec) <= fVar5)
                         && local_10f8._12_4_ <= auVar60._12_4_;
              }
              else {
                bVar12 = local_10f8._0_4_ <= auVar60._0_4_;
                bVar13 = local_10f8._4_4_ <= auVar60._4_4_;
                bVar14 = local_10f8._8_4_ <= auVar60._8_4_;
                bVar15 = local_10f8._12_4_ <= auVar60._12_4_;
              }
              auVar54._0_4_ = (uint)bVar12 * -0x80000000;
              auVar54._4_4_ = (uint)bVar13 * -0x80000000;
              auVar54._8_4_ = (uint)bVar14 * -0x80000000;
              auVar54._12_4_ = (uint)bVar15 * -0x80000000;
              uVar26 = movmskps((int)unaff_R15,auVar54);
              unaff_R15 = CONCAT44(uVar27,uVar26);
            }
          }
          if ((uVar19 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar28 = 4;
            }
            else {
              uVar18 = uVar19 & 0xfffffffffffffff0;
              lVar11 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              iVar28 = 0;
              uVar19 = *(ulong *)(uVar18 + lVar11 * 8);
              uVar23 = unaff_R15 - 1 & unaff_R15;
              if (uVar23 != 0) {
                uVar20 = *(uint *)(local_10f8 + lVar11 * 4);
                lVar11 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                uVar9 = *(ulong *)(uVar18 + lVar11 * 8);
                uVar7 = *(uint *)(local_10f8 + lVar11 * 4);
                uVar23 = uVar23 - 1 & uVar23;
                if (uVar23 == 0) {
                  if (uVar20 < uVar7) {
                    *(ulong *)*pauVar22 = uVar9;
                    *(uint *)((long)*pauVar22 + 8) = uVar7;
                    pauVar22 = pauVar22 + 1;
                  }
                  else {
                    *(ulong *)*pauVar22 = uVar19;
                    *(uint *)((long)*pauVar22 + 8) = uVar20;
                    uVar19 = uVar9;
                    pauVar22 = pauVar22 + 1;
                  }
                }
                else {
                  auVar57._8_4_ = uVar20;
                  auVar57._0_8_ = uVar19;
                  auVar57._12_4_ = 0;
                  auVar75._8_4_ = uVar7;
                  auVar75._0_8_ = uVar9;
                  auVar75._12_4_ = 0;
                  lVar11 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                    }
                  }
                  uVar10 = *(undefined8 *)(uVar18 + lVar11 * 8);
                  iVar8 = *(int *)(local_10f8 + lVar11 * 4);
                  auVar65._8_4_ = iVar8;
                  auVar65._0_8_ = uVar10;
                  auVar65._12_4_ = 0;
                  auVar41._8_4_ = -(uint)((int)uVar20 < (int)uVar7);
                  uVar23 = uVar23 - 1 & uVar23;
                  if (uVar23 == 0) {
                    auVar41._4_4_ = auVar41._8_4_;
                    auVar41._0_4_ = auVar41._8_4_;
                    auVar41._12_4_ = auVar41._8_4_;
                    auVar83._8_4_ = uVar7;
                    auVar83._0_8_ = uVar9;
                    auVar83._12_4_ = 0;
                    auVar32 = blendvps(auVar83,auVar57,auVar41);
                    auVar60 = blendvps(auVar57,auVar75,auVar41);
                    auVar42._8_4_ = -(uint)(auVar32._8_4_ < iVar8);
                    auVar42._4_4_ = auVar42._8_4_;
                    auVar42._0_4_ = auVar42._8_4_;
                    auVar42._12_4_ = auVar42._8_4_;
                    auVar76._8_4_ = iVar8;
                    auVar76._0_8_ = uVar10;
                    auVar76._12_4_ = 0;
                    auVar101 = blendvps(auVar76,auVar32,auVar42);
                    auVar84 = blendvps(auVar32,auVar65,auVar42);
                    auVar43._8_4_ = -(uint)(auVar60._8_4_ < auVar84._8_4_);
                    auVar43._4_4_ = auVar43._8_4_;
                    auVar43._0_4_ = auVar43._8_4_;
                    auVar43._12_4_ = auVar43._8_4_;
                    auVar32 = blendvps(auVar84,auVar60,auVar43);
                    auVar60 = blendvps(auVar60,auVar84,auVar43);
                    *pauVar22 = auVar60;
                    pauVar22[1] = auVar32;
                    uVar19 = auVar101._0_8_;
                    pauVar22 = pauVar22 + 2;
                  }
                  else {
                    lVar11 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                      }
                    }
                    auVar44._4_4_ = auVar41._8_4_;
                    auVar44._0_4_ = auVar41._8_4_;
                    auVar44._8_4_ = auVar41._8_4_;
                    auVar44._12_4_ = auVar41._8_4_;
                    auVar84 = blendvps(auVar75,auVar57,auVar44);
                    auVar60 = blendvps(auVar57,auVar75,auVar44);
                    auVar90._8_4_ = *(int *)(local_10f8 + lVar11 * 4);
                    auVar90._0_8_ = *(undefined8 *)(uVar18 + lVar11 * 8);
                    auVar90._12_4_ = 0;
                    auVar45._8_4_ = -(uint)(iVar8 < *(int *)(local_10f8 + lVar11 * 4));
                    auVar45._4_4_ = auVar45._8_4_;
                    auVar45._0_4_ = auVar45._8_4_;
                    auVar45._12_4_ = auVar45._8_4_;
                    auVar101 = blendvps(auVar90,auVar65,auVar45);
                    auVar32 = blendvps(auVar65,auVar90,auVar45);
                    auVar46._8_4_ = -(uint)(auVar60._8_4_ < auVar32._8_4_);
                    auVar46._4_4_ = auVar46._8_4_;
                    auVar46._0_4_ = auVar46._8_4_;
                    auVar46._12_4_ = auVar46._8_4_;
                    auVar91 = blendvps(auVar32,auVar60,auVar46);
                    auVar60 = blendvps(auVar60,auVar32,auVar46);
                    auVar47._8_4_ = -(uint)(auVar84._8_4_ < auVar101._8_4_);
                    auVar47._4_4_ = auVar47._8_4_;
                    auVar47._0_4_ = auVar47._8_4_;
                    auVar47._12_4_ = auVar47._8_4_;
                    auVar32 = blendvps(auVar101,auVar84,auVar47);
                    auVar84 = blendvps(auVar84,auVar101,auVar47);
                    auVar48._8_4_ = -(uint)(auVar84._8_4_ < auVar91._8_4_);
                    auVar48._4_4_ = auVar48._8_4_;
                    auVar48._0_4_ = auVar48._8_4_;
                    auVar48._12_4_ = auVar48._8_4_;
                    auVar101 = blendvps(auVar91,auVar84,auVar48);
                    auVar84 = blendvps(auVar84,auVar91,auVar48);
                    *pauVar22 = auVar60;
                    pauVar22[1] = auVar84;
                    pauVar22[2] = auVar101;
                    uVar19 = auVar32._0_8_;
                    pauVar22 = pauVar22 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar28 = 6;
          }
        } while (iVar28 == 0);
        if (iVar28 == 6) {
          (**(code **)((long)local_10b8->leafIntersector +
                      (ulong)*(byte *)(uVar19 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_10b0);
          fVar49 = (local_10c0->super_RayK<1>).tfar;
          ray = local_10c0;
          fVar29 = fVar49;
          fVar30 = fVar49;
          fVar51 = fVar49;
          auVar31 = local_1068;
          fVar85 = local_1098;
          fVar92 = fStack_1094;
          fVar93 = fStack_1090;
          fVar108 = fStack_108c;
          fVar77 = local_1088;
          fVar50 = fStack_1084;
          fVar105 = fStack_1080;
          fVar78 = fStack_107c;
          fVar52 = local_10e8;
          fVar106 = fStack_10e4;
          fVar79 = fStack_10e0;
          fVar53 = fStack_10dc;
          fVar58 = local_10d8;
          fVar59 = fStack_10d4;
          fVar66 = fStack_10d0;
          fVar67 = fStack_10cc;
          fVar68 = local_1078;
          fVar69 = fStack_1074;
          fVar70 = fStack_1070;
          fVar71 = fStack_106c;
          fVar94 = local_10a8;
          fVar95 = fStack_10a4;
          fVar96 = fStack_10a0;
          fVar98 = fStack_109c;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }